

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O3

DdNode * Cudd_addDiff(DdManager *dd,DdNode **f,DdNode **g)

{
  double dVar1;
  double dVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  
  pDVar3 = *f;
  pDVar4 = *g;
  pDVar5 = dd->plusinfinity;
  pDVar6 = pDVar5;
  if ((pDVar3 != pDVar4) && (pDVar6 = pDVar4, pDVar3 != pDVar5)) {
    if (pDVar4 == pDVar5) {
      return pDVar3;
    }
    if ((pDVar3->index != 0x7fffffff) || (pDVar4->index != 0x7fffffff)) {
      return (DdNode *)0x0;
    }
    dVar1 = (pDVar3->type).value;
    dVar2 = (pDVar4->type).value;
    if (((dVar1 != dVar2) || (pDVar6 = pDVar5, NAN(dVar1) || NAN(dVar2))) &&
       (pDVar6 = pDVar4, dVar1 < dVar2)) {
      pDVar6 = pDVar3;
    }
  }
  return pDVar6;
}

Assistant:

DdNode *
Cudd_addDiff(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{
    DdNode *F, *G;

    F = *f; G = *g;
    if (F == G) return(DD_PLUS_INFINITY(dd));
    if (F == DD_PLUS_INFINITY(dd)) return(G);
    if (G == DD_PLUS_INFINITY(dd)) return(F);
    if (cuddIsConstant(F) && cuddIsConstant(G)) {
        if (cuddV(F) != cuddV(G)) {
            if (cuddV(F) < cuddV(G)) {
                return(F);
            } else {
                return(G);
            }
        } else {
            return(DD_PLUS_INFINITY(dd));
        }
    }
    return(NULL);

}